

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

void __thiscall CSocekt::msgSend(CSocekt *this,char *psendbuf)

{
  SourceFile file;
  int iVar1;
  char (*in_RDI) [100];
  MutexLockGuard lock;
  LogLevel in_stack_ffffffffffffefd8;
  int in_stack_ffffffffffffefdc;
  Logger *in_stack_ffffffffffffefe0;
  SourceFile *in_stack_ffffffffffffeff0;
  Logger *in_stack_fffffffffffff010;
  
  muduo::MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)in_stack_ffffffffffffefe0,
             (MutexLock *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
  std::__cxx11::list<char_*,_std::allocator<char_*>_>::push_back
            ((list<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffeff0,(value_type *)in_RDI
            );
  muduo::detail::AtomicIntegerT<int>::increment((AtomicIntegerT<int> *)0x13abd4);
  iVar1 = sem_post((sem_t *)(in_RDI + 0x42));
  if (iVar1 == -1) {
    muduo::Logger::SourceFile::SourceFile<100>(in_stack_ffffffffffffeff0,in_RDI);
    file._8_8_ = in_stack_ffffffffffffeff0;
    file.data_ = *in_RDI;
    muduo::Logger::Logger
              (in_stack_ffffffffffffefe0,file,in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8);
    muduo::Logger::stream((Logger *)&stack0xfffffffffffff000);
    muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffeff0,*in_RDI);
    muduo::Logger::~Logger(in_stack_fffffffffffff010);
  }
  muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x13ac96);
  return;
}

Assistant:

void CSocekt::msgSend(char *psendbuf) 
{
    muduo::MutexLockGuard lock(m_sendMessageQueueMutex);
    m_MsgSendQueue.push_back(psendbuf);    
    m_iSendMsgQueueCount.increment();   //原子操作

    //将信号量的值+1,这样其他卡在sem_wait的就可以走下去
    if(sem_post(&m_semEventSendQueue)==-1)  //让ServerSendQueueThread()流程走下来干活
    {
        LOG_ERROR << "CSocekt::msgSend()中sem_post(&m_semEventSendQueue)失败.";
   
    }
    return;
}